

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

_Bool textui_panel_contains(uint y,uint x)

{
  _Bool local_1d;
  uint local_1c;
  uint local_18;
  uint wid;
  uint hgt;
  uint x_local;
  uint y_local;
  
  if (Term == (term *)0x0) {
    x_local._3_1_ = true;
  }
  else {
    if (Term == angband_term[0]) {
      local_18 = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode]
                 ) / (int)(uint)tile_height;
      local_1c = ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
    }
    else {
      local_18 = Term->hgt / (int)(uint)tile_height;
      local_1c = Term->wid / (int)(uint)tile_width;
    }
    local_1d = false;
    if (y - Term->offset_y < local_18) {
      local_1d = x - Term->offset_x < local_1c;
    }
    x_local._3_1_ = local_1d;
  }
  return x_local._3_1_;
}

Assistant:

bool textui_panel_contains(unsigned int y, unsigned int x)
{
	unsigned int hgt;
	unsigned int wid;
	if (!Term)
		return true;
	if (Term == term_screen) {
		hgt = SCREEN_HGT;
		wid = SCREEN_WID;
	} else {
		hgt = Term->hgt / tile_height;
		wid = Term->wid / tile_width;
	}
	return (y - Term->offset_y) < hgt && (x - Term->offset_x) < wid;
}